

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O2

LLVMControlDependenceAnalysis * __thiscall
dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
          (LLVMControlDependenceAnalysis *this,BasicBlock *v)

{
  ValVec interproc;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_30;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_28;
  
  (**(code **)(**(long **)(v + 0x68) + 0x38))();
  if (v[100] == (BasicBlock)0x1) {
    (**(code **)(**(long **)(v + 0x70) + 0x38))
              ((_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)&local_30);
    std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
    insert<__gnu_cxx::__normal_iterator<llvm::Value**,std::vector<llvm::Value*,std::allocator<llvm::Value*>>>,void>
              ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)this,
               (const_iterator)
               (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,local_30,
               local_28);
    std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base
              ((_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)&local_30);
  }
  return this;
}

Assistant:

ValVec _getDependencies(ValT v) {
        assert(_impl);
        auto ret = _impl->getDependencies(v);

        if (getOptions().interproceduralCD()) {
            assert(_interprocImpl);
            auto interproc = _interprocImpl->getDependencies(v);
            ret.insert(ret.end(), interproc.begin(), interproc.end());
        }
        return ret;
    }